

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyOncePragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  bool bVar1;
  BufferID BVar2;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *hash_00;
  char **__y;
  long in_RSI;
  long in_RDI;
  string_view sVar3;
  string_view text;
  locator loc;
  size_t pos0;
  size_t hash;
  char **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  char **in_stack_fffffffffffffe38;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *in_stack_fffffffffffffe40;
  SourceLocation *in_stack_fffffffffffffe48;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *pos0_00;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *this_00;
  table_element_pointer in_stack_fffffffffffffe80;
  SourceManager *in_stack_fffffffffffffe88;
  Preprocessor *in_stack_fffffffffffffe90;
  BufferID buffer;
  undefined4 in_stack_fffffffffffffea0;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_char_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  SourceLocation *local_78;
  undefined1 *local_70;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SourceLocation *local_10;
  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  *local_8;
  
  ensurePragmaArgs(in_stack_fffffffffffffe90,(PragmaDirectiveSyntax *)in_stack_fffffffffffffe88,
                   (size_t)in_stack_fffffffffffffe80);
  buffer.id = (uint32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  Token::location((Token *)(in_RSI + 0x18));
  BVar2 = SourceLocation::buffer(in_stack_fffffffffffffe48);
  sVar3 = SourceManager::getSourceText(in_stack_fffffffffffffe88,buffer);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffea8);
  if (!bVar1) {
    hash_00 = (table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
               *)(in_RDI + 0x238);
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffea8);
    local_70 = &stack0xfffffffffffffe90;
    pos0_00 = hash_00;
    local_68 = hash_00;
    local_78 = (SourceLocation *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
               ::key_from<char_const*>((char **)0x38bb56);
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
               ::hash_for<char_const*>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
               ::position_for(in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
    local_10 = local_78;
    local_20 = local_80;
    this_00 = pos0_00;
    local_18 = local_88;
    local_8 = pos0_00;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<const_char_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_char_*>_>
                 ::groups((table_arrays<const_char_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_char_*>_>
                           *)0x38bc10);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<const_char_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_char_*>_>
                   ::elements((table_arrays<const_char_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_char_*>_>
                               *)0x38bc5b);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffe40 =
               (table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                          *)0x38bcab);
          in_stack_fffffffffffffe48 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                ::key_from<char_const*>((char **)0x38bcd8);
          bVar1 = std::equal_to<const_char_*>::operator()
                            ((equal_to<const_char_*> *)in_stack_fffffffffffffe40,
                             (char **)in_stack_fffffffffffffe48,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_char_*>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0038bdcc;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      if (bVar1) {
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_char_*>
        ::table_locator(&local_a0);
        goto LAB_0038bdcc;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,(this_00->arrays).groups_size_mask);
    } while (bVar1);
    memset(&local_a0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_char_*>
    ::table_locator(&local_a0);
LAB_0038bdcc:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                 ::make_iterator((locator *)0x38bdec);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffe78,&local_b0,&local_b1);
    }
    else if ((pos0_00->size_ctrl).size < (pos0_00->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_at<char_const*>
                (this_00,(size_t)pos0_00,(size_t)hash_00,(char **)in_stack_fffffffffffffe48);
      local_c8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                 ::make_iterator((locator *)0x38be69);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffe78,&local_c8,local_e1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_with_rehash<char_const*>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                  *)sVar3._M_str,sVar3._M_len,(char **)CONCAT44(BVar2.id,in_stack_fffffffffffffea0))
      ;
      local_f8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*,_void>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                 ::make_iterator((locator *)0x38becc);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_char_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
                  *)&stack0xfffffffffffffe78,&local_f8,local_111);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyOncePragma(const PragmaDirectiveSyntax& pragma) {
    ensurePragmaArgs(pragma, 0);

    auto text = sourceManager.getSourceText(pragma.directive.location().buffer());
    if (!text.empty())
        includeOnceHeaders.emplace(text.data());
}